

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O3

void __thiscall MppThread::MppThread(MppThread *this,MppThreadFunc func,void *ctx,char *name)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    MppMutexCond::MppMutexCond((MppMutexCond *)((long)this->mMutexCond + lVar1 + -8));
    lVar1 = lVar1 + 0x58;
  } while (lVar1 != 0x168);
  this->mFunction = func;
  this->mContext = ctx;
  this->mStatus[0] = MPP_THREAD_UNINITED;
  this->mStatus[1] = MPP_THREAD_RUNNING;
  this->mStatus[2] = MPP_THREAD_RUNNING;
  this->mStatus[3] = MPP_THREAD_RUNNING;
  if (name != (char *)0x0) {
    strncpy(this->mName,name,0xf);
    return;
  }
  builtin_strncpy(this->mName,"mpp_thread",0xb);
  return;
}

Assistant:

MppThread::MppThread(MppThreadFunc func, void *ctx, const char *name)
    : mFunction(func),
      mContext(ctx)
{
    mStatus[THREAD_WORK]    = MPP_THREAD_UNINITED;
    mStatus[THREAD_INPUT]   = MPP_THREAD_RUNNING;
    mStatus[THREAD_OUTPUT]  = MPP_THREAD_RUNNING;
    mStatus[THREAD_CONTROL] = MPP_THREAD_RUNNING;

    if (name)
        strncpy(mName, name, sizeof(mName) - 1);
    else
        snprintf(mName, sizeof(mName) - 1, "mpp_thread");
}